

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::texparameterIiv(NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar2;
  NotSupportedError *this;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_51;
  string local_50;
  GLint local_30 [2];
  GLint textureMode [2];
  NegativeTestContext *ctx_local;
  
  pRVar2 = NegativeTestContext::getRenderContext(ctx);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  if (!bVar1) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this,"glTexParameterIiv is not supported.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeTextureApiTests.cpp"
               ,0x8b8);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
  }
  local_30[0] = 0x1902;
  local_30[1] = 0x1901;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"GL_INVALID_ENUM is generated if target is not a valid target.",
             &local_51);
  NegativeTestContext::beginSection(ctx,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0,0x90ea,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"GL_INVALID_ENUM is generated if pname is not a valid parameter.",
             &local_79);
  NegativeTestContext::beginSection(ctx,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value."
             ,&local_a1);
  NegativeTestContext::beginSection(ctx,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  local_30[0] = -1;
  local_30[1] = -1;
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0x90ea,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0x884c,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0x884d,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0x2800,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0x2801,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0x8e42,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0x8e43,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0x8e44,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0x8e45,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0x2802,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0x2803,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0x8072,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative."
             ,&local_c9);
  NegativeTestContext::beginSection(ctx,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0x813c,local_30);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0x813d,local_30);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,
             "GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid."
             ,&local_f1);
  NegativeTestContext::beginSection(ctx,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  local_30[0] = 0;
  local_30[1] = 0;
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9100,0x1004,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9100,0x2801,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9100,0x2800,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9100,0x2802,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9100,0x2803,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9100,0x8072,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9100,0x813a,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9100,0x813b,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9100,0x884c,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9100,0x884d,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9102,0x1004,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9102,0x2801,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9102,0x2800,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9102,0x2802,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9102,0x2803,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9102,0x8072,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9102,0x813a,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9102,0x813b,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9102,0x884c,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9102,0x884d,local_30);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0."
             ,&local_119);
  NegativeTestContext::beginSection(ctx,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  local_30[0] = 1;
  local_30[1] = 1;
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9100,0x813c,local_30);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glTexParameterIiv(&ctx->super_CallLogWrapper,0x9102,0x813c,local_30);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texparameterIiv (NegativeTestContext& ctx)
{
	if (!contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		throw tcu::NotSupportedError("glTexParameterIiv is not supported.", DE_NULL, __FILE__, __LINE__);

	GLint textureMode[] = { GL_DEPTH_COMPONENT, GL_STENCIL_INDEX };
	ctx.beginSection("GL_INVALID_ENUM is generated if target is not a valid target.");
	ctx.glTexParameterIiv(0, GL_DEPTH_STENCIL_TEXTURE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not a valid parameter.");
	ctx.glTexParameterIiv(GL_TEXTURE_2D, 0, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value.");
	textureMode[0] = -1;
	textureMode[1] = -1;
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_G, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_B, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_A, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative.");
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, textureMode);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexParameterIiv(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, textureMode);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid.");
	textureMode[0] = 0;
	textureMode[1] = 0;
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BORDER_COLOR, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAG_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_S, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_T, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAX_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_FUNC, textureMode);
	ctx.expectError(GL_INVALID_ENUM);

	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BORDER_COLOR, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAG_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_S, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_T, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAX_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_FUNC, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0.");
	textureMode[0] = 1;
	textureMode[1] = 1;
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BASE_LEVEL, textureMode);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glTexParameterIiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BASE_LEVEL, textureMode);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();
}